

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

PyObject * pybind11::detail::dict_getitemstring(PyObject *v,char *key)

{
  PyObject *op;
  error_already_set *peVar1;
  PyObject *pPVar2;
  long lVar3;
  PyObject *rv;
  PyObject *kv;
  char *key_local;
  PyObject *v_local;
  
  op = (PyObject *)PyUnicode_FromString(key);
  if (op == (PyObject *)0x0) {
    peVar1 = (error_already_set *)__cxa_allocate_exception(0x28);
    error_already_set::error_already_set(peVar1);
    __cxa_throw(peVar1,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  pPVar2 = (PyObject *)PyDict_GetItemWithError(v,op);
  _Py_DECREF(op);
  if (pPVar2 == (PyObject *)0x0) {
    lVar3 = PyErr_Occurred();
    if (lVar3 != 0) {
      peVar1 = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(peVar1);
      __cxa_throw(peVar1,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
  }
  return pPVar2;
}

Assistant:

inline PyObject * dict_getitemstring(PyObject *v, const char *key)
{
#if PY_MAJOR_VERSION >= 3
    PyObject *kv = nullptr, *rv = nullptr;
    kv = PyUnicode_FromString(key);
    if (kv == NULL) {
        throw error_already_set();
    }

    rv = PyDict_GetItemWithError(v, kv);
    Py_DECREF(kv);
    if (rv == NULL && PyErr_Occurred()) {
        throw error_already_set();
    }
    return rv;
#else
    return PyDict_GetItemString(v, key);
#endif
}